

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

RefractDataOut cert::refract_func(Vec3 *v,Vec3 *n,float ni_over_nt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  RefractDataOut RVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int local_58;
  undefined8 uStack_54;
  
  dVar7 = sqrt((double)(ulong)(uint)(v->z * v->z + v->x * v->x + v->y * v->y));
  fVar9 = SUB84(dVar7,0);
  fVar13 = v->z / fVar9;
  uVar1 = v->x;
  uVar4 = v->y;
  auVar14._4_4_ = uVar4;
  auVar14._0_4_ = uVar1;
  auVar14._8_8_ = 0;
  auVar15._4_4_ = fVar9;
  auVar15._0_4_ = fVar9;
  auVar15._8_4_ = fVar9;
  auVar15._12_4_ = fVar9;
  auVar15 = divps(auVar14,auVar15);
  uVar2 = n->x;
  uVar5 = n->y;
  fVar9 = n->z;
  fVar11 = fVar13 * fVar9 + auVar15._0_4_ * (float)uVar2 + auVar15._4_4_ * (float)uVar5;
  fVar10 = 1.0 - (1.0 - fVar11 * fVar11) * ni_over_nt * ni_over_nt;
  fVar12 = 0.0;
  if (fVar10 <= 0.0) {
    local_58 = (uint)local_58._1_3_ << 8;
    uStack_54 = 0;
  }
  else {
    local_58 = CONCAT31(local_58._1_3_,1);
    dVar7 = sqrt((double)(ulong)(uint)fVar10);
    fVar10 = SUB84(dVar7,0);
    fVar12 = (fVar13 - fVar9 * fVar11) * ni_over_nt - n->z * fVar10;
    uVar3 = n->x;
    uVar6 = n->y;
    uStack_54 = CONCAT44(ni_over_nt * (auVar15._4_4_ - (float)uVar5 * fVar11) -
                         fVar10 * (float)uVar6,
                         ni_over_nt * (auVar15._0_4_ - (float)uVar2 * fVar11) -
                         fVar10 * (float)uVar3);
  }
  RVar8.refracted.x = (float)(undefined4)uStack_54;
  RVar8.refracted.y = (float)uStack_54._4_4_;
  RVar8._0_4_ = local_58;
  RVar8.refracted.z = fVar12;
  return RVar8;
}

Assistant:

constexpr RefractDataOut refract_func (Vec3 const& v, Vec3 const& n, float ni_over_nt)
{
	Vec3 uv = normalize (v);
	float dt = dot (uv, n);
	float discriminant = 1.0 - ni_over_nt * ni_over_nt * (1 - dt * dt);
	if (discriminant > 0)
	{
		return { true, ni_over_nt * (uv - n * dt) - n * sqrt (discriminant) };
	}
	else
		return { false };
}